

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O3

void llvm::DWARFYAML::EmitDebugRanges(raw_ostream *OS,Data *DI)

{
  uint uVar1;
  pointer pRVar2;
  uint uVar3;
  undefined8 in_RAX;
  size_t __n;
  pointer pRVar4;
  undefined8 local_38;
  
  pRVar2 = (DI->Ranges).
           super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (DI->Ranges).
                super__Vector_base<llvm::DWARFYAML::Range,_std::allocator<llvm::DWARFYAML::Range>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar2; pRVar4 = pRVar4 + 1) {
    uVar3 = (uint)pRVar4->Start;
    uVar1 = (uint)pRVar4->End;
    local_38._4_4_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
    ;
    if (DI->IsLittleEndian != false) {
      local_38._4_4_ = uVar3;
    }
    __n = (size_t)local_38._4_4_;
    local_38._0_4_ = (undefined4)in_RAX;
    raw_ostream::write(OS,(int)&local_38 + 4,(void *)0x4,__n);
    uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (DI->IsLittleEndian != false) {
      uVar3 = uVar1;
    }
    local_38 = CONCAT44(local_38._4_4_,uVar3);
    raw_ostream::write(OS,(int)&local_38,(void *)0x4,__n);
    in_RAX = local_38;
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugRanges(raw_ostream &OS, const DWARFYAML::Data &DI) {
  // As DwarfStreamer.cpp says, "The debug_range section
  // format is totally trivial, consisting just of pairs of address
  // sized addresses describing the ranges." and apparently it ends
  // with a null termination of a pair of zeros
  for (auto Range : DI.Ranges) {
    writeInteger((uint32_t)Range.Start, OS, DI.IsLittleEndian);
    writeInteger((uint32_t)Range.End, OS, DI.IsLittleEndian);
  }
}